

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

int Acb_ObjAlloc(Acb_Ntk_t *p,Acb_ObjType_t Type,int nFans,int nFons)

{
  Vec_Que_t *p_00;
  int i_00;
  int iVar1;
  float **pCosts;
  int local_44;
  int local_28;
  int iObj;
  int CioId;
  int nFansReal;
  int i;
  int nFons_local;
  int nFans_local;
  Acb_ObjType_t Type_local;
  Acb_Ntk_t *p_local;
  
  local_28 = -1;
  i_00 = Vec_StrSize(&p->vObjType);
  Vec_StrPush(&p->vObjType,(char)Type);
  if (Type == ABC_OPER_CI) {
    if (nFans != 0) {
      __assert_fail("nFans == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x1d3,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
    }
    local_28 = Vec_IntSize(&p->vCis);
    Vec_IntPush(&p->vCis,i_00);
    iObj = 2;
  }
  else if (Type == ABC_OPER_CO) {
    if (nFans != 1) {
      __assert_fail("nFans == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x1da,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
    }
    local_28 = Vec_IntSize(&p->vCos);
    Vec_IntPush(&p->vCos,i_00);
    iObj = 2;
  }
  else {
    iVar1 = Acb_ObjIsBox(p,i_00);
    iObj = Abc_MaxInt(nFans + iVar1,p->nFaninMax);
  }
  iVar1 = Vec_IntSize(&p->vFanSto);
  Vec_IntPush(&p->vObjFans,iVar1);
  Vec_IntPush(&p->vFanSto,0);
  for (CioId = 0; CioId < iObj; CioId = CioId + 1) {
    if ((local_28 < 0) || (CioId != 1)) {
      local_44 = -1;
    }
    else {
      local_44 = local_28;
    }
    Vec_IntPush(&p->vFanSto,local_44);
  }
  iVar1 = Acb_ObjIsBox(p,i_00);
  if ((iVar1 != 0) && (nFons < 1)) {
    __assert_fail("!Acb_ObjIsBox(p, iObj) || nFons > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x1e7,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
  }
  for (CioId = 0; CioId < nFons; CioId = CioId + 1) {
    iVar1 = Acb_ObjAlloc(p,ABC_OPER_FON,1,0);
    Acb_ObjAddFanin(p,iVar1,i_00);
  }
  iVar1 = Acb_NtkHasObjCopies(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vObjCopy,-1);
  }
  iVar1 = Acb_NtkHasObjFuncs(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vObjFunc,-1);
  }
  iVar1 = Acb_NtkHasObjWeights(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vObjWeight,0);
  }
  iVar1 = Acb_NtkHasObjTruths(p);
  if (iVar1 != 0) {
    Vec_WrdPush(&p->vObjTruth,0);
  }
  iVar1 = Acb_NtkHasObjNames(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vObjName,0);
  }
  iVar1 = Acb_NtkHasObjRanges(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vObjRange,0);
  }
  iVar1 = Acb_NtkHasObjTravs(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vObjTrav,0);
  }
  iVar1 = Acb_NtkHasObjAttrs(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vObjAttr,0);
  }
  iVar1 = Acb_NtkHasObjLevelD(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vLevelD,0);
  }
  iVar1 = Acb_NtkHasObjLevelR(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vLevelR,0);
  }
  iVar1 = Acb_NtkHasObjPathD(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vPathD,0);
  }
  iVar1 = Acb_NtkHasObjPathR(p);
  if (iVar1 != 0) {
    Vec_IntPush(&p->vPathR,0);
  }
  iVar1 = Acb_NtkHasObjCounts(p);
  if (iVar1 != 0) {
    Vec_FltPush(&p->vCounts,0.0);
  }
  iVar1 = Acb_NtkHasObjFanout(p);
  if (iVar1 != 0) {
    Vec_WecPushLevel(&p->vFanouts);
  }
  iVar1 = Acb_NtkHasObjCnfs(p);
  if (iVar1 != 0) {
    Vec_WecPushLevel(&p->vCnfs);
  }
  if (p->vQue != (Vec_Que_t *)0x0) {
    p_00 = p->vQue;
    pCosts = Vec_FltArrayP(&p->vCounts);
    Vec_QueSetPriority(p_00,pCosts);
  }
  return i_00;
}

Assistant:

static inline int Acb_ObjAlloc( Acb_Ntk_t * p, Acb_ObjType_t Type, int nFans, int nFons )
{
    int i, nFansReal, CioId = -1, iObj = Vec_StrSize(&p->vObjType);
    Vec_StrPush( &p->vObjType, (char)Type );
    if ( Type == ABC_OPER_CI )
    {
        assert( nFans == 0 );
        CioId = Vec_IntSize( &p->vCis );
        Vec_IntPush( &p->vCis, iObj );
        nFansReal = 2;
    }
    else if ( Type == ABC_OPER_CO )
    {
        assert( nFans == 1 );
        CioId = Vec_IntSize( &p->vCos );
        Vec_IntPush( &p->vCos, iObj );
        nFansReal = 2;
    }
    else 
        nFansReal = Abc_MaxInt( nFans + Acb_ObjIsBox(p, iObj), p->nFaninMax );
    // add fins
    Vec_IntPush( &p->vObjFans, Vec_IntSize(&p->vFanSto) );
    Vec_IntPush( &p->vFanSto, 0 );
    for ( i = 0; i < nFansReal; i++ )
        Vec_IntPush( &p->vFanSto, (CioId >= 0 && i == 1) ? CioId : -1 );
    // add fons
    assert( !Acb_ObjIsBox(p, iObj) || nFons > 0 );
    for ( i = 0; i < nFons; i++ )
        Acb_ObjAddFanin( p, Acb_ObjAlloc(p, ABC_OPER_FON, 1, 0), iObj );
    // extend storage
    if ( Acb_NtkHasObjCopies(p) ) Vec_IntPush(&p->vObjCopy  , -1);
    if ( Acb_NtkHasObjFuncs(p)  ) Vec_IntPush(&p->vObjFunc  , -1);
    if ( Acb_NtkHasObjWeights(p)) Vec_IntPush(&p->vObjWeight,  0);
    if ( Acb_NtkHasObjTruths(p) ) Vec_WrdPush(&p->vObjTruth ,  0);
    if ( Acb_NtkHasObjNames(p)  ) Vec_IntPush(&p->vObjName  ,  0);
    if ( Acb_NtkHasObjRanges(p) ) Vec_IntPush(&p->vObjRange ,  0);
    if ( Acb_NtkHasObjTravs(p)  ) Vec_IntPush(&p->vObjTrav  ,  0);
    if ( Acb_NtkHasObjAttrs(p)  ) Vec_IntPush(&p->vObjAttr  ,  0);
    if ( Acb_NtkHasObjLevelD(p) ) Vec_IntPush(&p->vLevelD   ,  0);
    if ( Acb_NtkHasObjLevelR(p) ) Vec_IntPush(&p->vLevelR   ,  0);
    if ( Acb_NtkHasObjPathD(p)  ) Vec_IntPush(&p->vPathD    ,  0);
    if ( Acb_NtkHasObjPathR(p)  ) Vec_IntPush(&p->vPathR    ,  0);
    if ( Acb_NtkHasObjCounts(p) ) Vec_FltPush(&p->vCounts   ,  0);
    if ( Acb_NtkHasObjFanout(p) ) Vec_WecPushLevel(&p->vFanouts);
    if ( Acb_NtkHasObjCnfs(p)   ) Vec_WecPushLevel(&p->vCnfs);
    if ( p->vQue ) Vec_QueSetPriority( p->vQue, Vec_FltArrayP(&p->vCounts) );
    return iObj;
}